

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureFilteringTests.cpp
# Opt level: O0

void __thiscall
vkt::texture::anon_unknown_0::Texture2DFilteringTestInstance::Texture2DFilteringTestInstance
          (Texture2DFilteringTestInstance *this,Context *context,ParameterType *testParameters)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  TestTexture2D *pTVar4;
  reference pvVar5;
  reference texture;
  size_type sVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  float fVar7;
  float fVar8;
  Vector<float,_2> local_29c;
  Vector<float,_2> local_294;
  FilterCase local_28c;
  float local_278;
  float local_274;
  float sY;
  float sX;
  float oY;
  float oX;
  float lodY;
  float lodX;
  int texNdx;
  int caseNdx;
  anon_struct_20_5_d494354b cases [4];
  __normal_iterator<de::SharedPtr<vkt::pipeline::TestTexture2D>_*,_std::vector<de::SharedPtr<vkt::pipeline::TestTexture2D>,_std::allocator<de::SharedPtr<vkt::pipeline::TestTexture2D>_>_>_>
  local_200;
  __normal_iterator<de::SharedPtr<vkt::pipeline::TestTexture2D>_*,_std::vector<de::SharedPtr<vkt::pipeline::TestTexture2D>,_std::allocator<de::SharedPtr<vkt::pipeline::TestTexture2D>_>_>_>
  local_1f8;
  iterator i;
  Vector<float,_4> local_1dc;
  Vec4 local_1cc;
  RGBA local_1bc;
  Vector<float,_4> local_1b8;
  Vector<float,_4> local_1a8;
  Vec4 local_198;
  PixelBufferAccess local_188;
  uint local_15c;
  uint local_158;
  deUint32 colorB;
  deUint32 colorA;
  deUint32 rgb;
  deUint32 step;
  int levelNdx_1;
  Vector<float,_4> local_11c;
  Vector<float,_4> local_10c;
  undefined1 local_fc [8];
  Vec4 gMax;
  Vector<float,_4> local_dc;
  undefined1 local_cc [8];
  Vec4 gMin;
  int levelNdx;
  SharedPtr<vkt::pipeline::TestTexture2D> local_b0;
  int local_a0;
  undefined1 local_9c [4];
  int ndx;
  Vec4 cScale;
  Vec4 cBias;
  undefined1 local_74 [8];
  TextureFormatInfo fmtInfo;
  int numLevels;
  bool mipmaps;
  ParameterType *testParameters_local;
  Context *context_local;
  Texture2DFilteringTestInstance *this_local;
  
  TestInstance::TestInstance(&this->super_TestInstance,context);
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__Texture2DFilteringTestInstance_016b4280;
  util::Texture2DTestCaseParameters::Texture2DTestCaseParameters
            (&this->m_testParameters,testParameters);
  std::
  vector<de::SharedPtr<vkt::pipeline::TestTexture2D>,_std::allocator<de::SharedPtr<vkt::pipeline::TestTexture2D>_>_>
  ::vector(&this->m_textures);
  std::
  vector<vkt::texture::(anonymous_namespace)::Texture2DFilteringTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::Texture2DFilteringTestInstance::FilterCase>_>
  ::vector(&this->m_cases);
  util::TextureRenderer::TextureRenderer
            (&this->m_renderer,context,
             (testParameters->super_TextureCommonTestCaseParameters).sampleCount,0x40,0x40);
  this->m_caseNdx = 0;
  fmtInfo.lookupBias.m_data[3]._3_1_ = 1;
  iVar2 = de::max<int>((this->m_testParameters).width,(this->m_testParameters).height);
  iVar2 = deLog2Floor32(iVar2);
  fmtInfo.lookupBias.m_data[2] = (float)(iVar2 + 1);
  cBias.m_data._8_8_ =
       ::vk::mapVkFormat((this->m_testParameters).super_TextureCommonTestCaseParameters.format);
  tcu::getTextureFormatInfo((TextureFormatInfo *)local_74,(TextureFormat *)(cBias.m_data + 2));
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(cScale.m_data + 2),(Vector<float,_4> *)local_74);
  tcu::operator-((tcu *)local_9c,(Vector<float,_4> *)(fmtInfo.valueMin.m_data + 2),
                 (Vector<float,_4> *)local_74);
  std::
  vector<de::SharedPtr<vkt::pipeline::TestTexture2D>,_std::allocator<de::SharedPtr<vkt::pipeline::TestTexture2D>_>_>
  ::reserve(&this->m_textures,2);
  for (local_a0 = 0; local_a0 < 2; local_a0 = local_a0 + 1) {
    pTVar4 = (TestTexture2D *)operator_new(0x70);
    register0x00000000 =
         ::vk::mapVkFormat((this->m_testParameters).super_TextureCommonTestCaseParameters.format);
    vkt::pipeline::TestTexture2D::TestTexture2D
              (pTVar4,(TextureFormat *)(gMin.m_data + 3),(this->m_testParameters).width,
               (this->m_testParameters).height);
    de::SharedPtr<vkt::pipeline::TestTexture2D>::SharedPtr(&local_b0,pTVar4);
    std::
    vector<de::SharedPtr<vkt::pipeline::TestTexture2D>,_std::allocator<de::SharedPtr<vkt::pipeline::TestTexture2D>_>_>
    ::push_back(&this->m_textures,&local_b0);
    de::SharedPtr<vkt::pipeline::TestTexture2D>::~SharedPtr(&local_b0);
  }
  for (gMin.m_data[2] = 0.0; (int)gMin.m_data[2] < (int)fmtInfo.lookupBias.m_data[2];
      gMin.m_data[2] = (float)((int)gMin.m_data[2] + 1)) {
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(gMax.m_data + 2),0.0,0.0,0.0,1.0);
    tcu::operator*((tcu *)&local_dc,(Vector<float,_4> *)(gMax.m_data + 2),
                   (Vector<float,_4> *)local_9c);
    tcu::operator+((tcu *)local_cc,&local_dc,(Vector<float,_4> *)(cScale.m_data + 2));
    tcu::Vector<float,_4>::Vector(&local_11c,1.0,1.0,1.0,0.0);
    tcu::operator*((tcu *)&local_10c,&local_11c,(Vector<float,_4> *)local_9c);
    tcu::operator+((tcu *)local_fc,&local_10c,(Vector<float,_4> *)(cScale.m_data + 2));
    pvVar5 = std::
             vector<de::SharedPtr<vkt::pipeline::TestTexture2D>,_std::allocator<de::SharedPtr<vkt::pipeline::TestTexture2D>_>_>
             ::operator[](&this->m_textures,0);
    pTVar4 = de::SharedPtr<vkt::pipeline::TestTexture2D>::operator->(pvVar5);
    (*(pTVar4->super_TestTexture)._vptr_TestTexture[7])(&step,pTVar4,(ulong)(uint)gMin.m_data[2],0);
    tcu::fillWithComponentGradients((PixelBufferAccess *)&step,(Vec4 *)local_cc,(Vec4 *)local_fc);
  }
  for (rgb = 0; (int)rgb < (int)fmtInfo.lookupBias.m_data[2]; rgb = rgb + 1) {
    colorA = (deUint32)(0xffffff / (long)(int)fmtInfo.lookupBias.m_data[2]);
    colorB = colorA * rgb;
    local_158 = colorB | 0xff000000;
    local_15c = ~colorB | 0xff000000;
    pvVar5 = std::
             vector<de::SharedPtr<vkt::pipeline::TestTexture2D>,_std::allocator<de::SharedPtr<vkt::pipeline::TestTexture2D>_>_>
             ::operator[](&this->m_textures,1);
    pTVar4 = de::SharedPtr<vkt::pipeline::TestTexture2D>::operator->(pvVar5);
    (*(pTVar4->super_TestTexture)._vptr_TestTexture[7])(&local_188,pTVar4,(ulong)rgb,0);
    tcu::RGBA::RGBA(&local_1bc,local_158);
    tcu::RGBA::toVec((RGBA *)&local_1b8);
    tcu::operator*((tcu *)&local_1a8,&local_1b8,(Vector<float,_4> *)local_9c);
    tcu::operator+((tcu *)&local_198,&local_1a8,(Vector<float,_4> *)(cScale.m_data + 2));
    tcu::RGBA::RGBA((RGBA *)&i,local_15c);
    tcu::RGBA::toVec((RGBA *)((long)&i._M_current + 4));
    tcu::operator*((tcu *)&local_1dc,(Vector<float,_4> *)((long)&i._M_current + 4),
                   (Vector<float,_4> *)local_9c);
    tcu::operator+((tcu *)&local_1cc,&local_1dc,(Vector<float,_4> *)(cScale.m_data + 2));
    tcu::fillWithGrid(&local_188,4,&local_198,&local_1cc);
  }
  local_1f8._M_current =
       (SharedPtr<vkt::pipeline::TestTexture2D> *)
       std::
       vector<de::SharedPtr<vkt::pipeline::TestTexture2D>,_std::allocator<de::SharedPtr<vkt::pipeline::TestTexture2D>_>_>
       ::begin(&this->m_textures);
  while( true ) {
    local_200._M_current =
         (SharedPtr<vkt::pipeline::TestTexture2D> *)
         std::
         vector<de::SharedPtr<vkt::pipeline::TestTexture2D>,_std::allocator<de::SharedPtr<vkt::pipeline::TestTexture2D>_>_>
         ::end(&this->m_textures);
    bVar1 = __gnu_cxx::operator!=(&local_1f8,&local_200);
    if (!bVar1) break;
    texture = __gnu_cxx::
              __normal_iterator<de::SharedPtr<vkt::pipeline::TestTexture2D>_*,_std::vector<de::SharedPtr<vkt::pipeline::TestTexture2D>,_std::allocator<de::SharedPtr<vkt::pipeline::TestTexture2D>_>_>_>
              ::operator*(&local_1f8);
    util::TextureRenderer::add2DTexture(&this->m_renderer,texture);
    cases[3]._12_8_ =
         __gnu_cxx::
         __normal_iterator<de::SharedPtr<vkt::pipeline::TestTexture2D>_*,_std::vector<de::SharedPtr<vkt::pipeline::TestTexture2D>,_std::allocator<de::SharedPtr<vkt::pipeline::TestTexture2D>_>_>_>
         ::operator++(&local_1f8,0);
  }
  memcpy(&texNdx,&DAT_01385410,0x50);
  for (lodX = 0.0; (int)lodX < 4; lodX = (float)((int)lodX + 1)) {
    iVar2 = (&texNdx)[(long)(int)lodX * 5];
    sVar6 = std::
            vector<de::SharedPtr<vkt::pipeline::TestTexture2D>,_std::allocator<de::SharedPtr<vkt::pipeline::TestTexture2D>_>_>
            ::size(&this->m_textures);
    lodY = (float)de::clamp<int>(iVar2,0,(int)sVar6 + -1);
    oX = cases[(long)(int)lodX + -1].oY;
    oY = (float)cases[(int)lodX].texNdx;
    sX = cases[(int)lodX].lodX;
    sY = cases[(int)lodX].lodY;
    fVar7 = deFloatExp2(oX);
    dVar3 = util::TextureRenderer::getRenderWidth(&this->m_renderer);
    pvVar5 = std::
             vector<de::SharedPtr<vkt::pipeline::TestTexture2D>,_std::allocator<de::SharedPtr<vkt::pipeline::TestTexture2D>_>_>
             ::operator[](&this->m_textures,(long)(int)lodY);
    pTVar4 = de::SharedPtr<vkt::pipeline::TestTexture2D>::operator->(pvVar5);
    iVar2 = (*(pTVar4->super_TestTexture)._vptr_TestTexture[0x11])();
    iVar2 = tcu::Texture2D::getWidth((Texture2D *)CONCAT44(extraout_var,iVar2));
    local_274 = (fVar7 * (float)dVar3) / (float)iVar2;
    fVar8 = deFloatExp2(oY);
    dVar3 = util::TextureRenderer::getRenderHeight(&this->m_renderer);
    pvVar5 = std::
             vector<de::SharedPtr<vkt::pipeline::TestTexture2D>,_std::allocator<de::SharedPtr<vkt::pipeline::TestTexture2D>_>_>
             ::operator[](&this->m_textures,(long)(int)lodY);
    pTVar4 = de::SharedPtr<vkt::pipeline::TestTexture2D>::operator->(pvVar5);
    iVar2 = (*(pTVar4->super_TestTexture)._vptr_TestTexture[0x11])();
    iVar2 = tcu::Texture2D::getHeight((Texture2D *)CONCAT44(extraout_var_00,iVar2));
    fVar7 = lodY;
    local_278 = (fVar8 * (float)dVar3) / (float)iVar2;
    tcu::Vector<float,_2>::Vector(&local_294,sX,sY);
    tcu::Vector<float,_2>::Vector(&local_29c,sX + local_274,sY + local_278);
    FilterCase::FilterCase(&local_28c,(int)fVar7,&local_294,&local_29c);
    std::
    vector<vkt::texture::(anonymous_namespace)::Texture2DFilteringTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::Texture2DFilteringTestInstance::FilterCase>_>
    ::push_back(&this->m_cases,&local_28c);
  }
  return;
}

Assistant:

Texture2DFilteringTestInstance::Texture2DFilteringTestInstance (Context& context, const ParameterType& testParameters)
	: TestInstance			(context)
	, m_testParameters		(testParameters)
	, m_renderer			(context, testParameters.sampleCount, TEX2D_VIEWPORT_WIDTH, TEX2D_VIEWPORT_HEIGHT)
	, m_caseNdx				(0)
{
	const bool						mipmaps		= true;
	const int						numLevels	= mipmaps ? deLog2Floor32(de::max(m_testParameters.width, m_testParameters.height))+1 : 1;
	const tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(vk::mapVkFormat(m_testParameters.format));
	const tcu::Vec4					cBias		= fmtInfo.valueMin;
	const tcu::Vec4					cScale		= fmtInfo.valueMax-fmtInfo.valueMin;

	// Create 2 textures.
	m_textures.reserve(2);
	for (int ndx = 0; ndx < 2; ndx++)
		m_textures.push_back(TestTexture2DSp(new pipeline::TestTexture2D(vk::mapVkFormat(m_testParameters.format), m_testParameters.width, m_testParameters.height)));

	// Fill first gradient texture.
	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		const tcu::Vec4 gMin = tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f)*cScale + cBias;
		const tcu::Vec4 gMax = tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f)*cScale + cBias;

		tcu::fillWithComponentGradients(m_textures[0]->getLevel(levelNdx, 0), gMin, gMax);
	}

	// Fill second with grid texture.
	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		const deUint32	step	= 0x00ffffff / numLevels;
		const deUint32	rgb		= step*levelNdx;
		const deUint32	colorA	= 0xff000000 | rgb;
		const deUint32	colorB	= 0xff000000 | ~rgb;

		tcu::fillWithGrid(m_textures[1]->getLevel(levelNdx, 0), 4, tcu::RGBA(colorA).toVec()*cScale + cBias, tcu::RGBA(colorB).toVec()*cScale + cBias);
	}

	// Upload.
	for (vector<TestTexture2DSp>::iterator i = m_textures.begin(); i != m_textures.end(); i++)
	{
		m_renderer.add2DTexture(*i);
	}

	// Compute cases.
	{
		const struct
		{
			const int		texNdx;
			const float		lodX;
			const float		lodY;
			const float		oX;
			const float		oY;
		} cases[] =
		{
			{ 0,	1.6f,	2.9f,	-1.0f,	-2.7f	},
			{ 0,	-2.0f,	-1.35f,	-0.2f,	0.7f	},
			{ 1,	0.14f,	0.275f,	-1.5f,	-1.1f	},
			{ 1,	-0.92f,	-2.64f,	0.4f,	-0.1f	},
		};

		for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); caseNdx++)
		{
			const int	texNdx	= de::clamp(cases[caseNdx].texNdx, 0, (int)m_textures.size()-1);
			const float	lodX	= cases[caseNdx].lodX;
			const float	lodY	= cases[caseNdx].lodY;
			const float	oX		= cases[caseNdx].oX;
			const float	oY		= cases[caseNdx].oY;
			const float	sX		= deFloatExp2(lodX) * float(m_renderer.getRenderWidth()) / float(m_textures[texNdx]->getTexture().getWidth());
			const float	sY		= deFloatExp2(lodY) * float(m_renderer.getRenderHeight()) / float(m_textures[texNdx]->getTexture().getHeight());

			m_cases.push_back(FilterCase(texNdx, tcu::Vec2(oX, oY), tcu::Vec2(oX+sX, oY+sY)));
		}
	}
}